

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O3

string * __thiscall
absl::lts_20250127::status_internal::StatusRep::ToString_abi_cxx11_
          (string *__return_storage_ptr__,StatusRep *this,StatusToStringMode mode)

{
  FunctionRef<void_(std::basic_string_view<char,_std::char_traits<char>_>,_const_absl::lts_20250127::Cord_&)>
  visitor;
  StatusPayloadPrinter printer;
  string local_d8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  StatusCodeToString_abi_cxx11_(&local_d8,(lts_20250127 *)(ulong)this->code_,mode);
  local_88.piece_._M_len = local_d8._M_string_length;
  local_88.piece_._M_str = local_d8._M_dataplus._M_p;
  local_b8.piece_._M_len = 2;
  local_b8.piece_._M_str = ": ";
  local_58.piece_._M_str = (this->message_)._M_dataplus._M_p;
  local_58.piece_._M_len = (this->message_)._M_string_length;
  StrAppend(__return_storage_ptr__,&local_88,&local_b8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((mode & kDefault) != kWithNoExtraData) {
    local_b8.piece_._M_len = (size_t)GetStatusPayloadPrinter_abi_cxx11_();
    visitor.invoker_ =
         functional_internal::
         InvokeObject<absl::lts_20250127::status_internal::StatusRep::ToString[abi:cxx11](absl::lts_20250127::StatusToStringMode)const::__0,void,std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Cord_const&>
    ;
    visitor.ptr_.obj = &local_88;
    local_88.piece_._M_len = (size_t)&local_b8;
    local_88.piece_._M_str = (char *)__return_storage_ptr__;
    ForEachPayload(this,visitor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StatusRep::ToString(StatusToStringMode mode) const {
  std::string text;
  absl::StrAppend(&text, absl::StatusCodeToString(code()), ": ", message());

  const bool with_payload = (mode & StatusToStringMode::kWithPayload) ==
                            StatusToStringMode::kWithPayload;

  if (with_payload) {
    status_internal::StatusPayloadPrinter printer =
        status_internal::GetStatusPayloadPrinter();
    this->ForEachPayload([&](absl::string_view type_url,
                             const absl::Cord& payload) {
      absl::optional<std::string> result;
      if (printer) result = printer(type_url, payload);
      absl::StrAppend(
          &text, " [", type_url, "='",
          result.has_value() ? *result : absl::CHexEscape(std::string(payload)),
          "']");
    });
  }

  return text;
}